

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody
          (MessageGenerator *this,Printer *printer,vector<bool,_std::allocator<bool>_> *processed,
          bool copy_constructor)

{
  cpp *field;
  FieldDescriptor *pFVar1;
  pointer ppFVar2;
  FieldDescriptor *pFVar3;
  FieldGenerator *pFVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  int iVar8;
  ulong uVar9;
  FieldDescriptor *pFVar10;
  string pod_template;
  string last_field_name;
  string first_field_name;
  Formatter format;
  RunMap runs;
  string local_138;
  _Any_data local_118;
  _Manager_type local_108;
  code *pcStack_100;
  FieldGeneratorMap *local_f8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_f0;
  Printer *local_e8;
  string local_e0;
  string local_c0;
  Formatter local_a0;
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_e8 = printer;
  local_a0.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_a0.vars_._M_t,&(this->variables_)._M_t);
  local_f0 = &this->optimized_order_;
  local_118._1_7_ = 0;
  local_118._M_pod_data[0] = copy_constructor;
  pcStack_100 = std::
                _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:2947:25)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:2947:25)>
              ::_M_manager;
  local_118._8_8_ = this;
  anon_unknown_0::FindRuns
            ((RunMap *)&local_68,local_f0,
             (function<bool_(const_google::protobuf::FieldDescriptor_*)> *)&local_118);
  if (local_108 != (_Manager_type)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  local_118._M_unused._M_object = &local_108;
  local_118._8_8_ = 0;
  local_108 = (_Manager_type)((ulong)local_108 & 0xffffffffffffff00);
  pcVar5 = 
  "::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(\n    reinterpret_cast<char*>(&$first$_) - reinterpret_cast<char*>(this)),\n    0, static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n    reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n"
  ;
  if (copy_constructor) {
    pcVar5 = 
    "::memcpy(&$first$_, &from.$first$_,\n  static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n"
    ;
  }
  std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)0x0,(ulong)pcVar5);
  ppFVar2 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
    local_f8 = &this->field_generators_;
    uVar9 = 0;
    iVar8 = 0;
    do {
      uVar6 = uVar9 + 0x3f;
      if (-1 < (long)uVar9) {
        uVar6 = uVar9;
      }
      if (((processed->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar6 >> 6) +
            (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar9 & 0x3f) & 1) == 0) {
        field = (cpp *)ppFVar2[uVar9];
        field_00 = (FieldDescriptor *)
                   local_68._M_buckets[(long)((ulong)field % local_68._M_bucket_count)];
        pFVar3 = (FieldDescriptor *)0x0;
        if ((field_00 != (FieldDescriptor *)0x0) &&
           (pFVar3 = field_00, pFVar10 = *(FieldDescriptor **)field_00,
           field != *(cpp **)(*(FieldDescriptor **)field_00 + 8))) {
          while (pFVar1 = *(FieldDescriptor **)pFVar10, pFVar1 != (FieldDescriptor *)0x0) {
            field_00 = (FieldDescriptor *)((ulong)*(cpp **)(pFVar1 + 8) % local_68._M_bucket_count);
            pFVar3 = (FieldDescriptor *)0x0;
            if ((field_00 != (FieldDescriptor *)((ulong)field % local_68._M_bucket_count)) ||
               (pFVar3 = pFVar10, pFVar10 = pFVar1, field == *(cpp **)(pFVar1 + 8)))
            goto LAB_002af3c0;
          }
          pFVar3 = (FieldDescriptor *)0x0;
        }
LAB_002af3c0:
        if (pFVar3 == (FieldDescriptor *)0x0) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)pFVar3;
        }
        if ((lVar7 == 0) || (uVar6 = *(ulong *)(lVar7 + 0x10), uVar6 < 2)) {
          if (copy_constructor) {
            pFVar4 = FieldGeneratorMap::get(local_f8,(FieldDescriptor *)field);
            lVar7 = 0x68;
          }
          else {
            pFVar4 = FieldGeneratorMap::get(local_f8,(FieldDescriptor *)field);
            lVar7 = 0x78;
          }
          (**(code **)((long)pFVar4->_vptr_FieldGenerator + lVar7))(pFVar4,local_e8);
        }
        else {
          FieldName_abi_cxx11_(&local_c0,field,field_00);
          FieldName_abi_cxx11_
                    (&local_e0,
                     (cpp *)(local_f0->
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar6 + (uVar9 - 1)],field_01
                    );
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"first","");
          Formatter::Set<std::__cxx11::string>(&local_a0,&local_138,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"last","");
          Formatter::Set<std::__cxx11::string>(&local_a0,&local_138,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          Formatter::operator()<>(&local_a0,(char *)local_118._M_unused._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          iVar8 = iVar8 + (int)uVar6 + -1;
        }
      }
      iVar8 = iVar8 + 1;
      uVar9 = (ulong)iVar8;
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->optimized_order_).
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3))
    ;
  }
  if ((_Manager_type *)local_118._M_unused._0_8_ != &local_108) {
    operator_delete(local_118._M_unused._M_object);
  }
  std::
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a0.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateConstructorBody(io::Printer* printer,
                                               std::vector<bool> processed,
                                               bool copy_constructor) const {
  Formatter format(printer, variables_);

  const RunMap runs = FindRuns(
      optimized_order_, [copy_constructor, this](const FieldDescriptor* field) {
        return (copy_constructor && IsPOD(field)) ||
               (!copy_constructor &&
                CanBeManipulatedAsRawBytes(field, options_, scc_analyzer_));
      });

  std::string pod_template;
  if (copy_constructor) {
    pod_template =
        "::memcpy(&$first$_, &from.$first$_,\n"
        "  static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n";
  } else {
    pod_template =
        "::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(\n"
        "    reinterpret_cast<char*>(&$first$_) - "
        "reinterpret_cast<char*>(this)),\n"
        "    0, static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n"
        "    reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n";
  }

  for (int i = 0; i < optimized_order_.size(); ++i) {
    if (processed[i]) {
      continue;
    }

    const FieldDescriptor* field = optimized_order_[i];
    const auto it = runs.find(field);

    // We only apply the memset technique to runs of more than one field, as
    // assignment is better than memset for generated code clarity.
    if (it != runs.end() && it->second > 1) {
      // Use a memset, then skip run_length fields.
      const size_t run_length = it->second;
      const std::string first_field_name = FieldName(field);
      const std::string last_field_name =
          FieldName(optimized_order_[i + run_length - 1]);

      format.Set("first", first_field_name);
      format.Set("last", last_field_name);

      format(pod_template.c_str());

      i += run_length - 1;
      // ++i at the top of the loop.
    } else {
      if (copy_constructor) {
        field_generators_.get(field).GenerateCopyConstructorCode(printer);
      } else {
        field_generators_.get(field).GenerateConstructorCode(printer);
      }
    }
  }
}